

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O2

void __thiscall
symul::symul(symul *this,int *n,float *r,vec2f *boxS,vec2f *iniBox,float speed,float time)

{
  pointer ppVar1;
  result_type __sd;
  int i;
  long lVar2;
  long lVar3;
  float fVar4;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  allocator_type local_75;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int *local_40;
  anon_class_8_1_8991fb9c randFloat;
  
  local_68 = time;
  local_58 = speed;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  local_40 = n;
  std::vector<particle,_std::allocator<particle>_>::vector(&this->particles,(long)*n,&local_75);
  __sd = ::time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->mt_rand,__sd);
  this->box = *boxS;
  this->particleR = *r;
  this->timeTick = local_68;
  local_68 = -local_58;
  uStack_64 = uStack_54 ^ 0x80000000;
  uStack_60 = uStack_50 ^ 0x80000000;
  uStack_5c = uStack_4c ^ 0x80000000;
  lVar3 = 0xc;
  randFloat.this = this;
  for (lVar2 = 0; lVar2 < *local_40; lVar2 = lVar2 + 1) {
    local_6c = symul::anon_class_8_1_8991fb9c::operator()(&randFloat,*r + 0.0,iniBox->x - *r);
    local_70 = symul::anon_class_8_1_8991fb9c::operator()(&randFloat,*r + 0.0,iniBox->y - *r);
    local_74 = symul::anon_class_8_1_8991fb9c::operator()(&randFloat,local_68,local_58);
    fVar4 = symul::anon_class_8_1_8991fb9c::operator()(&randFloat,local_68,local_58);
    ppVar1 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(float *)((long)ppVar1 + lVar3 + -0xc) = local_6c;
    *(float *)((long)ppVar1 + lVar3 + -8) = local_70;
    *(float *)((long)ppVar1 + lVar3 + -4) = local_74;
    *(float *)((long)&(ppVar1->position).x + lVar3) = fVar4;
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

symul::symul(const int& n, const float& r, const vec2f& boxS, const vec2f& iniBox, float speed, float time)
    : particleR(r), box(boxS), particles(n), timeTick(time), mt_rand(std::time(0))
{
    auto randFloat = [&](float low, float high)
    {
        return low + (high - low) * (static_cast<float>(mt_rand() - mt_rand.min()) / static_cast<float>(mt_rand.max()));
    };
    for(int i = 0; i < n; i++)
        particles[i] = particle(vec2f(randFloat(0 + r, iniBox.getX() - r), randFloat(0 + r, iniBox.getY() - r)),
                                vec2f(randFloat(-speed, speed), randFloat(-speed, speed)));
}